

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O3

void gatom_vis(t_gobj *z,_glist *glist,int vis)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  _glist *p_Var5;
  size_t sVar6;
  t_symbol *ptVar7;
  int iVar8;
  int y1;
  int x1;
  int local_450;
  int x2;
  double local_448;
  double local_440;
  char *tags [3];
  char buf [1000];
  
  text_vis(z,glist,vis);
  if (*(char *)&(z[5].g_pd)->c_name->s_name == '\0') {
    return;
  }
  iVar2 = sprintf(buf,"%lx.l",z);
  if (vis == 0) {
    p_Var5 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar2));
    pdgui_vmess((char *)0x0,"crs",p_Var5,"delete",buf);
    return;
  }
  tags[1] = "label";
  tags[2] = "text";
  tags[0] = buf;
  iVar3 = glist_getzoom(glist);
  iVar2 = *(int *)((long)&z[7].g_pd + 4);
  if (iVar2 == 0) {
    iVar2 = glist_getfont((_glist *)z[3].g_next);
  }
  text_getrect(z,glist,&x1,&y1,&x2,&local_450);
  uVar4 = *(uint *)&z[7].g_next >> 1 & 3;
  p_Var5 = (_glist *)
           ((long)&switchD_00161a02::switchdataD_001b8b20 +
           (long)(int)(&switchD_00161a02::switchdataD_001b8b20)[uVar4]);
  switch(uVar4) {
  case 0:
    ptVar7 = canvas_realizedollar((_glist *)z[3].g_next,(t_symbol *)z[5].g_pd);
    sVar6 = strlen(ptVar7->s_name);
    iVar2 = sys_zoomfontwidth(iVar2,iVar3,0);
    uVar4 = iVar2 * (int)sVar6;
    p_Var5 = (_glist *)(ulong)uVar4;
    iVar8 = (x1 + iVar3 * -3) - uVar4;
    break;
  case 1:
    iVar8 = x2 + iVar3 * 2;
    break;
  case 2:
    iVar8 = x1 - iVar3;
    iVar2 = sys_zoomfontheight(iVar2,iVar3,0);
    p_Var5 = (_glist *)(ulong)(uint)(iVar2 + iVar3);
    iVar2 = y1 - (iVar2 + iVar3);
    goto LAB_00161ab1;
  case 3:
    iVar8 = x1 - iVar3;
    iVar2 = iVar3 * 3 + local_450;
    goto LAB_00161ab1;
  }
  iVar2 = iVar3 * 2 + y1;
LAB_00161ab1:
  p_Var5 = glist_getcanvas(p_Var5);
  local_440 = (double)iVar8;
  local_448 = (double)iVar2;
  ptVar7 = canvas_realizedollar((_glist *)z[3].g_next,(t_symbol *)z[5].g_pd);
  pcVar1 = ptVar7->s_name;
  iVar2 = *(int *)((long)&z[7].g_pd + 4);
  if (iVar2 == 0) {
    iVar2 = glist_getfont((_glist *)z[3].g_next);
  }
  iVar3 = glist_getzoom(glist);
  pdgui_vmess("pdtk_text_new","cS ff s ir",local_440,local_448,p_Var5,3,tags,pcVar1,
              (ulong)(uint)(iVar3 * iVar2),"black");
  return;
}

Assistant:

static void gatom_vis(t_gobj *z, t_glist *glist, int vis)
{
    t_gatom *x = (t_gatom*)z;
    text_vis(z, glist, vis);
    if (*x->a_label->s_name)
    {
        char buf[MAXPDSTRING];
        sprintf(buf, "%lx.l", x);
        if (vis)
        {
            int x1, y1;
            char *tags[] = {
                buf,
                "label",
                "text"
            };
            gatom_getwherelabel(x, glist, &x1, &y1);
            pdgui_vmess("pdtk_text_new", "cS ff s ir",
                glist_getcanvas(glist),
                3, tags,
                (double)x1, (double)y1,
                canvas_realizedollar(x->a_glist, x->a_label)->s_name,
                gatom_fontsize(x) * glist_getzoom(glist), "black");
        }
        else
            pdgui_vmess(0, "crs", glist_getcanvas(glist), "delete", buf);
    }
}